

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# option.cpp
# Opt level: O3

const_iterator pstore::command_line::option::add_to_global_list(option *opt)

{
  _List_node_base *p_Var1;
  
  all_abi_cxx11_();
  p_Var1 = (_List_node_base *)operator_new(0x18);
  p_Var1[1]._M_next = (_List_node_base *)opt;
  std::__detail::_List_node_base::_M_hook(p_Var1);
  all[abi:cxx11]()::all_options_abi_cxx11_.
  super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>.
  _M_impl._M_node._M_size =
       all[abi:cxx11]()::all_options_abi_cxx11_.
       super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
       ._M_impl._M_node._M_size + 1;
  return (const_iterator)
         all[abi:cxx11]()::all_options_abi_cxx11_.
         super__List_base<pstore::command_line::option_*,_std::allocator<pstore::command_line::option_*>_>
         ._M_impl._M_node.super__List_node_base._M_prev;
}

Assistant:

auto option::add_to_global_list (option * const opt)
                -> options_container::const_iterator {
                options_container & all = option::all ();
                all.push_back (opt);
                return std::prev (all.end ());
            }